

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O1

MDD make_random_ldd_set(int depth,int maxvalue,int elements)

{
  long lVar1;
  size_t count;
  int iVar2;
  uint64_t uVar3;
  MDD lddmc;
  ulong uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined8 uStack_50;
  uint32_t auStack_48 [2];
  size_t local_40;
  int local_38;
  int local_34;
  
  lVar1 = -((ulong)(uint)depth * 4 + 0xf & 0xfffffffffffffff0);
  iVar5 = 0;
  if (maxvalue < 1) {
    lddmc = 0;
  }
  else {
    local_40 = (size_t)depth;
    lddmc = 0;
    local_38 = maxvalue;
    local_34 = depth;
    do {
      iVar2 = local_34;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1076be;
      lddmc_refs_push(lddmc);
      if (0 < iVar2) {
        uVar4 = 0;
        do {
          *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1076cb;
          uVar3 = xorshift_rand();
          auVar6._8_4_ = (int)(uVar3 >> 0x20);
          auVar6._0_8_ = uVar3;
          auVar6._12_4_ = 0x45300000;
          ((uint32_t *)((long)auStack_48 + lVar1))[uVar4] =
               (int)(((auVar6._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                     5.421010862427522e-20 * 10.0 + 0.0);
          uVar4 = uVar4 + 1;
        } while ((uint)depth != uVar4);
      }
      count = local_40;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x107733;
      lddmc = lddmc_union_cube(lddmc,(uint32_t *)((long)auStack_48 + lVar1),count);
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x107740;
      lddmc_refs_pop(1);
      iVar5 = iVar5 + 1;
    } while (iVar5 != local_38);
  }
  return lddmc;
}

Assistant:

static MDD
make_random_ldd_set(int depth, int maxvalue, int elements)
{
    uint32_t values[depth];
    MDD result = mtbdd_false; // empty set
    for (int i=0; i<elements; i++) {
        lddmc_refs_push(result);
        for (int j=0; j<depth; j++) {
            values[j] = rng(0, maxvalue);
        }
        result = lddmc_union_cube(result, values, depth);
        lddmc_refs_pop(1);
    }
    return result;
}